

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PushFunctionBlockerBarrier(cmMakefile *this)

{
  size_type local_18;
  cmMakefile *local_10;
  cmMakefile *this_local;
  
  local_10 = this;
  local_18 = std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::size
                       (&this->FunctionBlockers);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->FunctionBlockerBarriers,&local_18);
  return;
}

Assistant:

void cmMakefile::PushFunctionBlockerBarrier()
{
  this->FunctionBlockerBarriers.push_back(this->FunctionBlockers.size());
}